

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_henson::Array_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/src/chai/data.cpp:47:30)>
::do_call(Proxy_Function_Callable_Impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_henson::Array_&),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mrzv[P]henson_src_chai_data_cpp:47:30)>
          *this,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params,
         Type_Conversions_State *t_conversions)

{
  bool bVar1;
  Result_Type pAVar2;
  ulong uVar3;
  Type_Conversions_State *in_RCX;
  ulong uVar4;
  size_type extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_00;
  Boxed_Value BVar5;
  initializer_list<bool> bs;
  detail local_59;
  size_t local_58;
  size_t sStack_50;
  size_t *local_40;
  string local_38 [32];
  
  pAVar2 = boxed_cast<henson::Array_const&>
                     ((Boxed_Value *)(t_conversions->m_conversions)._M_data,in_RCX);
  local_58 = pAVar2->count;
  sStack_50 = pAVar2->stride;
  local_59 = (detail)(*(index_t *)
                       ((long)&(pAVar2->address).impl_.
                               super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                               .
                               super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                               .
                               super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>
                               .
                               super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                               .
                               super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                       + 8) != 0xffffffff);
  bs._M_len = extraout_RDX;
  bs._M_array = (iterator)0x1;
  bVar1 = mpark::detail::all(&local_59,bs);
  if (bVar1) {
    local_40 = &local_58;
    uVar3 = (ulong)*(index_t *)
                    ((long)&(pAVar2->address).impl_.
                            super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                            .
                            super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                            .
                            super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>
                            .
                            super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                            .
                            super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                    + 8);
    uVar4 = 0xffffffffffffffff;
    if (uVar3 != 0xffffffff) {
      uVar4 = uVar3;
    }
    (**(code **)(mpark::detail::visitation::
                 fmatrix<mpark::detail::visitation::variant::value_visitor<chai_data(chaiscript::ChaiScript&,henson::NameMap&)::$_1::operator()(henson::Array_const&)const::extract>&&,mpark::detail::base<(mpark::detail::Trait)0,void*,float*,double*,int*,long*>const&>
                 ::value_abi_cxx11_ + uVar4 * 8))(local_38,&local_40,pAVar2);
    detail::Handle_Return<std::__cxx11::string>::handle<std::__cxx11::string,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    std::__cxx11::string::~string(local_38);
    BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX_00._M_pi;
    BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (Boxed_Value)
           BVar5.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
  }
  mpark::throw_bad_variant_access();
}

Assistant:

virtual Boxed_Value do_call(const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions) const CHAISCRIPT_OVERRIDE
        {
          typedef typename detail::Function_Signature<Func>::Return_Type Return_Type;
          return detail::Do_Call<Return_Type>::template go<Func>(m_f, params, t_conversions);
        }